

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_csm.c
# Opt level: O0

void * CSM_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  int iVar1;
  void *unpkarc;
  PHYSFS_uint16 count;
  int *piStack_30;
  PHYSFS_uint8 buf [4];
  int *claimed_local;
  int forWriting_local;
  char *name_local;
  PHYSFS_Io *io_local;
  
  piStack_30 = claimed;
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/icculus[P]physfs/src/physfs_archiver_csm.c"
                  ,0x49,"void *CSM_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar1 = __PHYSFS_readAll(io,(void *)((long)&unpkarc + 4),4);
    if (iVar1 == 0) {
      io_local = (PHYSFS_Io *)0x0;
    }
    else if (unpkarc._4_4_ == 0x64695343) {
      *piStack_30 = 1;
      iVar1 = __PHYSFS_readAll(io,(void *)((long)&unpkarc + 2),2);
      if (iVar1 == 0) {
        io_local = (PHYSFS_Io *)0x0;
      }
      else {
        unpkarc._2_2_ = PHYSFS_swapULE16(unpkarc._2_2_);
        io_local = (PHYSFS_Io *)UNPK_openArchive(io,0,1);
        if (io_local == (PHYSFS_Io *)0x0) {
          io_local = (PHYSFS_Io *)0x0;
        }
        else {
          iVar1 = csmLoadEntries(io,unpkarc._2_2_,io_local);
          if (iVar1 == 0) {
            UNPK_abandonArchive(io_local);
            io_local = (PHYSFS_Io *)0x0;
          }
        }
      }
    }
    else {
      PHYSFS_setErrorCode(PHYSFS_ERR_UNSUPPORTED);
      io_local = (PHYSFS_Io *)0x0;
    }
  }
  else {
    PHYSFS_setErrorCode(PHYSFS_ERR_READ_ONLY);
    io_local = (PHYSFS_Io *)0x0;
  }
  return io_local;
}

Assistant:

static void *CSM_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    PHYSFS_uint8 buf[4];
    PHYSFS_uint16 count;
    void *unpkarc;

    assert(io != NULL);  /* shouldn't ever happen. */

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);
    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, buf, sizeof (buf)), NULL);
    if (memcmp(buf, "CSid", 4) != 0)
        BAIL(PHYSFS_ERR_UNSUPPORTED, NULL);

    *claimed = 1;

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &count, sizeof (count)), NULL);
    count = PHYSFS_swapULE16(count);


    unpkarc = UNPK_openArchive(io, 0, 1);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!csmLoadEntries(io, count, unpkarc))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    return unpkarc;
}